

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::SegmentInfo::set_writing_app(SegmentInfo *this,char *app)

{
  size_t __n;
  void *__dest;
  char *in_RSI;
  long in_RDI;
  char *temp_str;
  size_t length;
  
  if (in_RSI != (char *)0x0) {
    __n = strlen(in_RSI);
    __dest = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    if (__dest != (void *)0x0) {
      memcpy(__dest,in_RSI,__n);
      *(undefined1 *)((long)__dest + __n) = 0;
      if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x18));
      }
      *(void **)(in_RDI + 0x18) = __dest;
    }
  }
  return;
}

Assistant:

void SegmentInfo::set_writing_app(const char* app) {
  if (app) {
    const size_t length = strlen(app) + 1;
    char* temp_str = new (std::nothrow) char[length];  // NOLINT
    if (!temp_str)
      return;

    memcpy(temp_str, app, length - 1);
    temp_str[length - 1] = '\0';

    delete[] writing_app_;
    writing_app_ = temp_str;
  }
}